

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::DynamicMapField::SyncMapWithRepeatedFieldNoLock(DynamicMapField *this)

{
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this_00;
  RepeatedPtrField<google::protobuf::Message> *pRVar1;
  Rep *pRVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  uint32_t uVar6;
  undefined4 extraout_var;
  FieldDescriptor *field;
  undefined4 extraout_var_00;
  FieldDescriptor *field_00;
  LogMessage *other;
  Node *pNVar7;
  Message *pMVar8;
  undefined4 extraout_var_01;
  pointer pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Reflection *this_02;
  void **ppvVar10;
  void **ppvVar11;
  float fVar12;
  iterator iter;
  undefined1 local_c8 [32];
  CppType local_a8;
  FieldDescriptor *local_98;
  DynamicMapField *local_90;
  undefined1 local_88 [56];
  string local_50;
  
  this_00 = &this->map_;
  (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
  iVar5 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
  field = Descriptor::map_key((Descriptor *)CONCAT44(extraout_var,iVar5));
  iVar5 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
  field_00 = Descriptor::map_value((Descriptor *)CONCAT44(extraout_var_00,iVar5));
  if ((this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
      .super_MapFieldBase.arena_ == (Arena *)0x0) {
    local_88._8_8_ = this_00;
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
    ::SearchFrom((iterator_base<google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
                  *)local_88,(this->map_).elements_.index_of_first_non_null_);
    local_c8._16_8_ = local_88._16_8_;
    local_c8._0_8_ = local_88._0_8_;
    local_c8._8_8_ = local_88._8_8_;
    if ((Node *)local_88._0_8_ != (Node *)0x0) {
      do {
        MapValueRef::DeleteData((MapValueRef *)(local_c8._0_8_ + 0x28));
        Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
        iterator_base<google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
        ::operator++((iterator_base<google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
                      *)local_c8);
      } while ((Node *)local_c8._0_8_ != (Node *)0x0);
    }
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::clear(&this_00->elements_)
  ;
  pRVar1 = (this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.repeated_field_;
  pRVar2 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
  ppvVar11 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar11 = (void **)0x0;
  }
  if (((long)(pRVar1->super_RepeatedPtrFieldBase).current_size_ & 0x1fffffffffffffffU) != 0) {
    local_90 = this;
    do {
      local_a8 = 0;
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_88._0_8_ = FieldDescriptor::TypeOnceInit;
        local_98 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_88,
                   &local_98);
      }
      pNVar7 = (Node *)local_c8._0_8_;
      switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4)) {
      case 1:
        uVar6 = Reflection::GetInt32(this_02,(Message *)*ppvVar11,field);
        if (local_a8 != CPPTYPE_INT32) {
          if ((local_a8 == CPPTYPE_STRING) && ((Node *)local_c8._0_8_ != (Node *)(local_c8 + 0x10)))
          {
            operator_delete((void *)local_c8._0_8_);
          }
          local_a8 = CPPTYPE_INT32;
        }
        goto LAB_003aca55;
      case 2:
        pNVar7 = (Node *)Reflection::GetInt64(this_02,(Message *)*ppvVar11,field);
        if (local_a8 != CPPTYPE_INT64) {
          if ((local_a8 == CPPTYPE_STRING) && ((Node *)local_c8._0_8_ != (Node *)(local_c8 + 0x10)))
          {
            operator_delete((void *)local_c8._0_8_);
          }
          local_a8 = CPPTYPE_INT64;
        }
        break;
      case 3:
        uVar6 = Reflection::GetUInt32(this_02,(Message *)*ppvVar11,field);
        if (local_a8 != CPPTYPE_UINT32) {
          if ((local_a8 == CPPTYPE_STRING) && ((Node *)local_c8._0_8_ != (Node *)(local_c8 + 0x10)))
          {
            operator_delete((void *)local_c8._0_8_);
          }
          local_a8 = CPPTYPE_UINT32;
        }
LAB_003aca55:
        local_c8._0_4_ = uVar6;
        pNVar7 = (Node *)local_c8._0_8_;
        break;
      case 4:
        pNVar7 = (Node *)Reflection::GetUInt64(this_02,(Message *)*ppvVar11,field);
        if (local_a8 != CPPTYPE_UINT64) {
          if ((local_a8 == CPPTYPE_STRING) && ((Node *)local_c8._0_8_ != (Node *)(local_c8 + 0x10)))
          {
            operator_delete((void *)local_c8._0_8_);
          }
          local_a8 = CPPTYPE_UINT64;
        }
        break;
      case 5:
      case 6:
      case 8:
      case 10:
        LogMessage::LogMessage
                  ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.cc"
                   ,0x22b);
        other = LogMessage::operator<<((LogMessage *)local_88,"Can\'t get here.");
        LogFinisher::operator=((LogFinisher *)&local_98,other);
        LogMessage::~LogMessage((LogMessage *)local_88);
        pNVar7 = (Node *)local_c8._0_8_;
        break;
      case 7:
        bVar4 = Reflection::GetBool(this_02,(Message *)*ppvVar11,field);
        if (local_a8 != CPPTYPE_BOOL) {
          if ((local_a8 == CPPTYPE_STRING) && ((Node *)local_c8._0_8_ != (Node *)(local_c8 + 0x10)))
          {
            operator_delete((void *)local_c8._0_8_);
          }
          local_a8 = CPPTYPE_BOOL;
        }
        local_c8[0] = bVar4;
        pNVar7 = (Node *)local_c8._0_8_;
        break;
      case 9:
        Reflection::GetString_abi_cxx11_(&local_50,this_02,(Message *)*ppvVar11,field);
        if (local_a8 != CPPTYPE_STRING) {
          local_a8 = CPPTYPE_STRING;
          local_c8._0_8_ = local_c8 + 0x10;
          local_c8._8_8_ = (InnerMap *)0x0;
          local_c8._16_8_ = local_c8._16_8_ & 0xffffffffffffff00;
        }
        std::__cxx11::string::operator=((string *)local_c8,(string *)&local_50);
        pNVar7 = (Node *)local_c8._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
          pNVar7 = (Node *)local_c8._0_8_;
        }
      }
      local_c8._0_8_ = pNVar7;
      if (((this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.arena_ == (Arena *)0x0) &&
         (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
          FindHelper<google::protobuf::MapKey>
                    ((pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>,_unsigned_long>
                      *)local_88,&this_00->elements_,(MapKey *)local_c8,(TreeIterator *)0x0),
         (Node *)local_88._0_8_ != (Node *)0x0)) {
        MapValueRef::DeleteData((MapValueRef *)(local_88._0_8_ + 0x28));
      }
      Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::
      insert<google::protobuf::MapKey_const&>
                ((pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>,_bool>
                  *)local_88,this_00,(MapKey *)local_c8);
      uVar3 = local_88._0_8_;
      if (*(once_flag **)(field_00 + 0x18) != (once_flag *)0x0) {
        local_88._0_8_ = FieldDescriptor::TypeOnceInit;
        local_98 = field_00;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field_00 + 0x18),(_func_void_FieldDescriptor_ptr **)local_88,
                   &local_98);
      }
      *(undefined4 *)(uVar3 + 0x30) =
           *(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field_00[2] * 4);
      if (*(once_flag **)(field_00 + 0x18) != (once_flag *)0x0) {
        local_88._0_8_ = FieldDescriptor::TypeOnceInit;
        local_98 = field_00;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field_00 + 0x18),(_func_void_FieldDescriptor_ptr **)local_88,
                   &local_98);
      }
      switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field_00[2] * 4)) {
      case 1:
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Arena::Create<int>((this->
                                     super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                     ).super_MapFieldBase.arena_);
        uVar6 = Reflection::GetInt32(this_02,(Message *)*ppvVar11,field_00);
        goto LAB_003accb6;
      case 2:
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Arena::Create<long>((this->
                                      super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                      ).super_MapFieldBase.arena_);
        pcVar9 = (pointer)Reflection::GetInt64(this_02,(Message *)*ppvVar11,field_00);
        goto LAB_003accdd;
      case 3:
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Arena::Create<unsigned_int>
                            ((this->
                             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                             ).super_MapFieldBase.arena_);
        uVar6 = Reflection::GetUInt32(this_02,(Message *)*ppvVar11,field_00);
        goto LAB_003accb6;
      case 4:
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Arena::Create<unsigned_long>
                            ((this->
                             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                             ).super_MapFieldBase.arena_);
        pcVar9 = (pointer)Reflection::GetUInt64(this_02,(Message *)*ppvVar11,field_00);
LAB_003accdd:
        (this_01->_M_dataplus)._M_p = pcVar9;
        break;
      case 5:
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Arena::Create<double>
                            ((this->
                             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                             ).super_MapFieldBase.arena_);
        pcVar9 = (pointer)Reflection::GetDouble(this_02,(Message *)*ppvVar11,field_00);
        (this_01->_M_dataplus)._M_p = pcVar9;
        break;
      case 6:
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Arena::Create<float>
                            ((this->
                             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                             ).super_MapFieldBase.arena_);
        fVar12 = Reflection::GetFloat(this_02,(Message *)*ppvVar11,field_00);
        *(float *)&(this_01->_M_dataplus)._M_p = fVar12;
        break;
      case 7:
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Arena::Create<bool>((this->
                                      super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                      ).super_MapFieldBase.arena_);
        bVar4 = Reflection::GetBool(this_02,(Message *)*ppvVar11,field_00);
        *(bool *)&(this_01->_M_dataplus)._M_p = bVar4;
        break;
      case 8:
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Arena::Create<int>((this->
                                     super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                     ).super_MapFieldBase.arena_);
        uVar6 = Reflection::GetEnumValue(this_02,(Message *)*ppvVar11,field_00);
LAB_003accb6:
        *(uint32_t *)&(this_01->_M_dataplus)._M_p = uVar6;
        break;
      case 9:
        this_01 = Arena::Create<std::__cxx11::string>
                            ((this->
                             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                             ).super_MapFieldBase.arena_);
        Reflection::GetString_abi_cxx11_((string *)local_88,this_02,(Message *)*ppvVar11,field_00);
        std::__cxx11::string::operator=((string *)this_01,(string *)local_88);
        if ((Node *)local_88._0_8_ != (Node *)(local_88 + 0x10)) {
          operator_delete((void *)local_88._0_8_);
        }
        break;
      case 10:
        pMVar8 = Reflection::GetMessage(this_02,(Message *)*ppvVar11,field_00,(MessageFactory *)0x0)
        ;
        iVar5 = (*(pMVar8->super_MessageLite)._vptr_MessageLite[3])
                          (pMVar8,(local_90->
                                  super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                  ).super_MapFieldBase.arena_);
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(extraout_var_01,iVar5);
        (**(code **)((this_01->_M_dataplus)._M_p + 0x68))(this_01,pMVar8);
        break;
      default:
        goto switchD_003acbc8_default;
      }
      *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(uVar3 + 0x28) =
           this_01;
      this = local_90;
switchD_003acbc8_default:
      if ((local_a8 == CPPTYPE_STRING) && ((Node *)local_c8._0_8_ != (Node *)(local_c8 + 0x10))) {
        operator_delete((void *)local_c8._0_8_);
      }
      ppvVar11 = ppvVar11 + 1;
      pRVar1 = (this->
               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
               ).super_MapFieldBase.repeated_field_;
      pRVar2 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
      ppvVar10 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar10 = (void **)0x0;
      }
    } while (ppvVar11 != ppvVar10 + (pRVar1->super_RepeatedPtrFieldBase).current_size_);
  }
  return;
}

Assistant:

void DynamicMapField::SyncMapWithRepeatedFieldNoLock() const {
  Map<MapKey, MapValueRef>* map = &const_cast<DynamicMapField*>(this)->map_;
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des = default_entry_->GetDescriptor()->map_key();
  const FieldDescriptor* val_des = default_entry_->GetDescriptor()->map_value();
  // DynamicMapField owns map values. Need to delete them before clearing
  // the map.
  if (MapFieldBase::arena_ == nullptr) {
    for (Map<MapKey, MapValueRef>::iterator iter = map->begin();
         iter != map->end(); ++iter) {
      iter->second.DeleteData();
    }
  }
  map->clear();
  for (RepeatedPtrField<Message>::iterator it =
           MapFieldBase::repeated_field_->begin();
       it != MapFieldBase::repeated_field_->end(); ++it) {
    // MapKey type will be set later.
    MapKey map_key;
    switch (key_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        map_key.SetStringValue(reflection->GetString(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        map_key.SetInt64Value(reflection->GetInt64(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        map_key.SetInt32Value(reflection->GetInt32(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        map_key.SetUInt64Value(reflection->GetUInt64(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        map_key.SetUInt32Value(reflection->GetUInt32(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        map_key.SetBoolValue(reflection->GetBool(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }

    if (MapFieldBase::arena_ == nullptr) {
      // Remove existing map value with same key.
      Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
      if (iter != map->end()) {
        iter->second.DeleteData();
      }
    }

    MapValueRef& map_val = (*map)[map_key];
    map_val.SetType(val_des->cpp_type());
    switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE, METHOD)                   \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: {                 \
    TYPE* value = Arena::Create<TYPE>(MapFieldBase::arena_); \
    *value = reflection->Get##METHOD(*it, val_des);          \
    map_val.SetValue(value);                                 \
    break;                                                   \
  }
      HANDLE_TYPE(INT32, int32_t, Int32);
      HANDLE_TYPE(INT64, int64_t, Int64);
      HANDLE_TYPE(UINT32, uint32_t, UInt32);
      HANDLE_TYPE(UINT64, uint64_t, UInt64);
      HANDLE_TYPE(DOUBLE, double, Double);
      HANDLE_TYPE(FLOAT, float, Float);
      HANDLE_TYPE(BOOL, bool, Bool);
      HANDLE_TYPE(STRING, std::string, String);
      HANDLE_TYPE(ENUM, int32_t, EnumValue);
#undef HANDLE_TYPE
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = reflection->GetMessage(*it, val_des);
        Message* value = message.New(MapFieldBase::arena_);
        value->CopyFrom(message);
        map_val.SetValue(value);
        break;
      }
    }
  }
}